

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserUtilsTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLParserUtilsTest_isSeparatorTest_Test::
~OpenDDLParserUtilsTest_isSeparatorTest_Test(OpenDDLParserUtilsTest_isSeparatorTest_Test *this)

{
  OpenDDLParserUtilsTest_isSeparatorTest_Test *this_local;
  
  ~OpenDDLParserUtilsTest_isSeparatorTest_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F( OpenDDLParserUtilsTest, isSeparatorTest ) {
    char val;
    val = ' ';
    EXPECT_TRUE( isSeparator( val ) );
    val = '\t';
    EXPECT_TRUE( isSeparator( val ) );
    val = '1';
    EXPECT_FALSE( isSeparator( val ) );
    val = 'a';
    EXPECT_FALSE( isSeparator( val ) );
    val = 'Z';
    EXPECT_FALSE( isSeparator( val ) );
    val = '{';
    EXPECT_TRUE( isSeparator( val ) );
    val = '}';
    EXPECT_TRUE( isSeparator( val ) );
    val = '[';
    EXPECT_TRUE( isSeparator( val ) );
}